

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::BendTypesSectionParser::parseLine
          (BendTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  uint in_ECX;
  string *in_RDX;
  string *at1_00;
  OpenMDException *e;
  RealType kScale;
  string remainder;
  string at3;
  string at2;
  string at1;
  int nTokens;
  BendType *bendType;
  BendTypeParser btParser;
  StringTokenizer tokenizer;
  RealType in_stack_000003c0;
  string *in_stack_000003c8;
  BendTypeParser *in_stack_000003d0;
  StringTokenizer *in_stack_fffffffffffffe40;
  StringTokenizer *in_stack_fffffffffffffe50;
  string *str;
  StringTokenizer *in_stack_fffffffffffffe80;
  ForceField *in_stack_fffffffffffffe90;
  StringTokenizer *in_stack_fffffffffffffea8;
  string local_150 [32];
  string local_130 [24];
  StringTokenizer *in_stack_fffffffffffffee8;
  string local_110 [32];
  undefined4 local_f0;
  int local_ec;
  BendType *local_e8;
  undefined1 local_99 [125];
  uint local_1c;
  
  str = (string *)local_99;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffe80->tokenString_,(char *)str,(allocator<char> *)in_RDX);
  StringTokenizer::StringTokenizer(in_stack_fffffffffffffe80,str,in_RDX);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  BendTypeParser::BendTypeParser((BendTypeParser *)at1.field_2._8_8_);
  local_e8 = (BendType *)0x0;
  local_ec = StringTokenizer::countTokens(in_stack_fffffffffffffe50);
  if (local_ec < 5) {
    snprintf(painCave.errMsg,2000,"BendTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    painCave.isFatal = 1;
    simError();
    local_f0 = 1;
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffee8);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffee8);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffee8);
    StringTokenizer::getRemainingString_abi_cxx11_(in_stack_fffffffffffffea8);
    at1_00 = (string *)ForceFieldOptions::getBendForceConstantScaling((ForceFieldOptions *)0x2a6f35)
    ;
    local_e8 = BendTypeParser::parseLine(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0);
    if (local_e8 != (BendType *)0x0) {
      ForceField::addBendType
                (in_stack_fffffffffffffe90,at1_00,&in_stack_fffffffffffffe80->tokenString_,str,
                 (BendType *)in_RDX);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_110);
    local_f0 = 0;
  }
  BendTypeParser::~BendTypeParser((BendTypeParser *)0x2a710b);
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffe40);
  return;
}

Assistant:

void BendTypesSectionParser::parseLine(ForceField& ff,
                                         const std::string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    BendTypeParser btParser;
    BendType* bendType = NULL;

    int nTokens = tokenizer.countTokens();

    if (nTokens < 5) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BendTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
      return;
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string at3       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();
    RealType kScale       = options_.getBendForceConstantScaling();

    try {
      bendType = btParser.parseLine(remainder, kScale);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BendTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (bendType != NULL) { ff.addBendType(at1, at2, at3, bendType); }
  }